

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O2

int32_t __thiscall
icu_63::Calendar::fieldDifference
          (Calendar *this,UDate targetMs,UCalendarDateFields field,UErrorCode *ec)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  double millis;
  double dVar7;
  
  uVar5 = 0;
  if (*ec < U_ILLEGAL_ARGUMENT_ERROR) {
    millis = getTimeInMillis(this,ec);
    if (millis < targetMs) {
      uVar4 = 1;
      uVar6 = 0;
      while (uVar3 = uVar4, *ec < U_ILLEGAL_ARGUMENT_ERROR) {
        setTimeInMillis(this,millis,ec);
        iVar2 = (int)uVar3;
        (*(this->super_UObject)._vptr_UObject[7])(this,field,uVar3,ec);
        dVar7 = getTimeInMillis(this,ec);
        if ((dVar7 == targetMs) && (!NAN(dVar7) && !NAN(targetMs))) {
          return iVar2;
        }
        if (targetMs < dVar7) break;
        if (iVar2 == 0x7fffffff) {
          *ec = U_ILLEGAL_ARGUMENT_ERROR;
          uVar4 = 0x7fffffff;
        }
        else {
          uVar5 = iVar2 * 2;
          if (0x7ffffffe < (uint)(iVar2 * 2)) {
            uVar5 = 0x7fffffff;
          }
          uVar4 = (ulong)uVar5;
          uVar6 = uVar3;
        }
      }
      do {
        uVar5 = (uint)uVar3 - (int)uVar6;
        if (((int)uVar5 < 2) || (U_ZERO_ERROR < *ec)) goto LAB_001f85ad;
        uVar5 = (uVar5 >> 1) + (int)uVar6;
        setTimeInMillis(this,millis,ec);
        (*(this->super_UObject)._vptr_UObject[7])(this,field,(ulong)uVar5,ec);
        dVar7 = getTimeInMillis(this,ec);
        uVar1 = uVar5;
        if (dVar7 <= targetMs) {
          uVar6 = (ulong)uVar5;
          uVar1 = (uint)uVar3;
        }
        uVar3 = (ulong)uVar1;
      } while ((dVar7 != targetMs) || (NAN(dVar7) || NAN(targetMs)));
    }
    else {
      uVar6 = 0;
      if (targetMs < millis) {
        uVar6 = 0;
        uVar5 = 0xffffffff;
        while (uVar1 = uVar5, uVar4 = (ulong)uVar1, *ec < U_ILLEGAL_ARGUMENT_ERROR) {
          setTimeInMillis(this,millis,ec);
          (*(this->super_UObject)._vptr_UObject[7])(this,field,uVar4,ec);
          dVar7 = getTimeInMillis(this,ec);
          if ((dVar7 == targetMs) && (!NAN(dVar7) && !NAN(targetMs))) {
            return uVar1;
          }
          if (dVar7 < targetMs) break;
          uVar6 = (ulong)uVar1;
          uVar5 = uVar1 * 2;
          if (uVar5 == 0) {
            *ec = U_ILLEGAL_ARGUMENT_ERROR;
            uVar6 = (ulong)uVar1;
          }
        }
        do {
          iVar2 = (int)uVar6;
          if ((iVar2 - (int)uVar4 < 2) || (U_ZERO_ERROR < *ec)) goto LAB_001f85ad;
          uVar5 = ((int)uVar4 - iVar2) / 2 + iVar2;
          setTimeInMillis(this,millis,ec);
          (*(this->super_UObject)._vptr_UObject[7])(this,field,(ulong)uVar5,ec);
          dVar7 = getTimeInMillis(this,ec);
          if (dVar7 < targetMs) {
            uVar4 = (ulong)uVar5;
          }
          else {
            uVar6 = (ulong)uVar5;
          }
        } while ((dVar7 != targetMs) || (NAN(dVar7) || NAN(targetMs)));
      }
      else {
LAB_001f85ad:
        setTimeInMillis(this,millis,ec);
        (*(this->super_UObject)._vptr_UObject[7])(this,field,uVar6,ec);
        uVar5 = 0;
        if (*ec < U_ILLEGAL_ARGUMENT_ERROR) {
          uVar5 = (uint)uVar6;
        }
      }
    }
  }
  return uVar5;
}

Assistant:

int32_t Calendar::fieldDifference(UDate targetMs, UCalendarDateFields field, UErrorCode& ec) {
    if (U_FAILURE(ec)) return 0;
    int32_t min = 0;
    double startMs = getTimeInMillis(ec);
    // Always add from the start millis.  This accomodates
    // operations like adding years from February 29, 2000 up to
    // February 29, 2004.  If 1, 1, 1, 1 is added to the year
    // field, the DOM gets pinned to 28 and stays there, giving an
    // incorrect DOM difference of 1.  We have to add 1, reset, 2,
    // reset, 3, reset, 4.
    if (startMs < targetMs) {
        int32_t max = 1;
        // Find a value that is too large
        while (U_SUCCESS(ec)) {
            setTimeInMillis(startMs, ec);
            add(field, max, ec);
            double ms = getTimeInMillis(ec);
            if (ms == targetMs) {
                return max;
            } else if (ms > targetMs) {
                break;
            } else if (max < INT32_MAX) {
                min = max;
                max <<= 1;
                if (max < 0) {
                    max = INT32_MAX;
                }
            } else {
                // Field difference too large to fit into int32_t
#if defined (U_DEBUG_CAL)
                fprintf(stderr, "%s:%d: ILLEGAL ARG because field %s's max too large for int32_t\n",
                    __FILE__, __LINE__, fldName(field));
#endif
                ec = U_ILLEGAL_ARGUMENT_ERROR;
            }
        }
        // Do a binary search
        while ((max - min) > 1 && U_SUCCESS(ec)) {
            int32_t t = min + (max - min)/2; // make sure intermediate values don't exceed INT32_MAX
            setTimeInMillis(startMs, ec);
            add(field, t, ec);
            double ms = getTimeInMillis(ec);
            if (ms == targetMs) {
                return t;
            } else if (ms > targetMs) {
                max = t;
            } else {
                min = t;
            }
        }
    } else if (startMs > targetMs) {
        int32_t max = -1;
        // Find a value that is too small
        while (U_SUCCESS(ec)) {
            setTimeInMillis(startMs, ec);
            add(field, max, ec);
            double ms = getTimeInMillis(ec);
            if (ms == targetMs) {
                return max;
            } else if (ms < targetMs) {
                break;
            } else {
                min = max;
                max <<= 1;
                if (max == 0) {
                    // Field difference too large to fit into int32_t
#if defined (U_DEBUG_CAL)
                    fprintf(stderr, "%s:%d: ILLEGAL ARG because field %s's max too large for int32_t\n",
                        __FILE__, __LINE__, fldName(field));
#endif
                    ec = U_ILLEGAL_ARGUMENT_ERROR;
                }
            }
        }
        // Do a binary search
        while ((min - max) > 1 && U_SUCCESS(ec)) {
            int32_t t = min + (max - min)/2; // make sure intermediate values don't exceed INT32_MAX
            setTimeInMillis(startMs, ec);
            add(field, t, ec);
            double ms = getTimeInMillis(ec);
            if (ms == targetMs) {
                return t;
            } else if (ms < targetMs) {
                max = t;
            } else {
                min = t;
            }
        }
    }
    // Set calendar to end point
    setTimeInMillis(startMs, ec);
    add(field, min, ec);

    /* Test for buffer overflows */
    if(U_FAILURE(ec)) {
        return 0;
    }
    return min;
}